

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signingprovider.cpp
# Opt level: O0

TaprootBuilder * __thiscall
TaprootBuilder::Add(TaprootBuilder *this,int depth,Span<const_unsigned_char> script,int leaf_version
                   ,bool track)

{
  Span<const_unsigned_char> script_00;
  byte bVar1;
  bool bVar2;
  vector<TaprootBuilder::LeafInfo,_std::allocator<TaprootBuilder::LeafInfo>_> *this_00;
  uchar *puVar3;
  pointer in_RCX;
  pointer in_RDX;
  TaprootBuilder *in_RDI;
  uint in_R8D;
  byte in_R9B;
  long in_FS_OFFSET;
  NodeInfo node;
  TaprootBuilder *in_stack_fffffffffffffec8;
  LeafInfo *__args;
  undefined8 in_stack_fffffffffffffef0;
  int depth_00;
  NodeInfo *in_stack_fffffffffffffef8;
  uchar *in_stack_ffffffffffffff08;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff10;
  undefined7 in_stack_ffffffffffffff18;
  TaprootBuilder *local_d0;
  undefined1 local_c1 [57];
  pointer local_88;
  pointer puStack_80;
  LeafInfo local_70;
  int local_38;
  undefined4 uStack_34;
  pointer local_30;
  pointer local_28;
  long local_8;
  
  depth_00 = (int)((ulong)in_stack_fffffffffffffef0 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = in_R9B & 1;
  if ((in_R8D & 0xffffff01) != 0) {
    __assert_fail("(leaf_version & ~TAPROOT_LEAF_MASK) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/signingprovider.cpp"
                  ,0x170,
                  "TaprootBuilder &TaprootBuilder::Add(int, Span<const unsigned char>, int, bool)");
  }
  local_70.script.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = in_RDX;
  local_70.script.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = in_RCX;
  bVar2 = IsValid(in_stack_fffffffffffffec8);
  local_d0 = in_RDI;
  if (bVar2) {
    NodeInfo::NodeInfo((NodeInfo *)in_stack_fffffffffffffec8);
    local_88 = local_70.script.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
    puStack_80 = local_70.script.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
    script_00.m_size = (size_t)in_stack_ffffffffffffff08;
    script_00.m_data = &in_RDI->m_valid;
    ComputeTapleafHash((uint8_t)((ulong)in_stack_fffffffffffffef8 >> 0x38),script_00);
    local_70.merkle_branch.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)local_70.script.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_38 = local_70.leaf_version;
    uStack_34 = local_70._28_4_;
    local_30 = local_70.merkle_branch.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
               super__Vector_impl_data._M_start;
    local_28 = local_70.merkle_branch.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
               super__Vector_impl_data._M_finish;
    if ((bVar1 & 1) != 0) {
      __args = &local_70;
      this_00 = (vector<TaprootBuilder::LeafInfo,_std::allocator<TaprootBuilder::LeafInfo>_> *)
                Span<const_unsigned_char>::begin
                          ((Span<const_unsigned_char> *)in_stack_fffffffffffffec8);
      puVar3 = Span<const_unsigned_char>::end
                         ((Span<const_unsigned_char> *)in_stack_fffffffffffffec8);
      depth_00 = (int)((ulong)puVar3 >> 0x20);
      in_stack_fffffffffffffef8 = (NodeInfo *)local_c1;
      std::allocator<unsigned_char>::allocator
                ((allocator<unsigned_char> *)in_stack_fffffffffffffec8);
      std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
                (in_stack_ffffffffffffff10,(uchar *)CONCAT17(bVar1,in_stack_ffffffffffffff18),
                 in_stack_ffffffffffffff08,(allocator_type *)in_RDI);
      local_c1._33_8_ = 0;
      local_c1._41_8_ = 0;
      local_c1._49_8_ = 0;
      std::vector<uint256,_std::allocator<uint256>_>::vector
                ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffffec8);
      std::vector<TaprootBuilder::LeafInfo,_std::allocator<TaprootBuilder::LeafInfo>_>::
      emplace_back<TaprootBuilder::LeafInfo>(this_00,__args);
      LeafInfo::~LeafInfo((LeafInfo *)in_stack_fffffffffffffec8);
      std::allocator<unsigned_char>::~allocator
                ((allocator<unsigned_char> *)in_stack_fffffffffffffec8);
    }
    Insert(in_RDI,in_stack_fffffffffffffef8,depth_00);
    NodeInfo::~NodeInfo((NodeInfo *)in_stack_fffffffffffffec8);
    local_d0 = in_RDI;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_d0;
}

Assistant:

TaprootBuilder& TaprootBuilder::Add(int depth, Span<const unsigned char> script, int leaf_version, bool track)
{
    assert((leaf_version & ~TAPROOT_LEAF_MASK) == 0);
    if (!IsValid()) return *this;
    /* Construct NodeInfo object with leaf hash and (if track is true) also leaf information. */
    NodeInfo node;
    node.hash = ComputeTapleafHash(leaf_version, script);
    if (track) node.leaves.emplace_back(LeafInfo{std::vector<unsigned char>(script.begin(), script.end()), leaf_version, {}});
    /* Insert into the branch. */
    Insert(std::move(node), depth);
    return *this;
}